

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O3

char * __thiscall btCollisionWorldImporter::duplicateName(btCollisionWorldImporter *this,char *name)

{
  char **ptr;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *__dest;
  char **ppcVar4;
  ulong uVar5;
  
  if (name == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(name);
    iVar1 = (int)sVar3;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (long)(iVar1 + 1)) {
      uVar5 = (long)(iVar1 + 1);
    }
    __dest = (char *)operator_new__(uVar5);
    memcpy(__dest,name,(long)iVar1);
    __dest[iVar1] = '\0';
    uVar2 = (this->m_allocatedNames).m_size;
    if (uVar2 == (this->m_allocatedNames).m_capacity) {
      iVar1 = 1;
      if (uVar2 != 0) {
        iVar1 = uVar2 * 2;
      }
      if ((int)uVar2 < iVar1) {
        if (iVar1 == 0) {
          ppcVar4 = (char **)0x0;
        }
        else {
          ppcVar4 = (char **)btAlignedAllocInternal((long)iVar1 << 3,0x10);
          uVar2 = (this->m_allocatedNames).m_size;
        }
        if (0 < (int)uVar2) {
          uVar5 = 0;
          do {
            ppcVar4[uVar5] = (this->m_allocatedNames).m_data[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        ptr = (this->m_allocatedNames).m_data;
        if ((ptr != (char **)0x0) && ((this->m_allocatedNames).m_ownsMemory == true)) {
          btAlignedFreeInternal(ptr);
          uVar2 = (this->m_allocatedNames).m_size;
        }
        (this->m_allocatedNames).m_ownsMemory = true;
        (this->m_allocatedNames).m_data = ppcVar4;
        (this->m_allocatedNames).m_capacity = iVar1;
      }
    }
    (this->m_allocatedNames).m_data[(int)uVar2] = __dest;
    (this->m_allocatedNames).m_size = uVar2 + 1;
  }
  return __dest;
}

Assistant:

char* btCollisionWorldImporter::duplicateName(const char* name)
{
	if (name)
	{
		int l = (int)strlen(name);
		char* newName = new char[l+1];
		memcpy(newName,name,l);
		newName[l] = 0;
		m_allocatedNames.push_back(newName);
		return newName;
	}
	return 0;
}